

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodePreviewDockSetup
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data,bool is_explicit_target,bool is_outer_docking)

{
  float fVar1;
  uint dir_00;
  long lVar2;
  bool bVar3;
  float *pfVar4;
  float local_f4;
  bool local_ea;
  byte local_e9;
  ImVec2 *local_e8;
  ImVec2 *local_e0;
  bool local_d3;
  byte local_d2;
  byte local_d1;
  uint local_d0;
  ImGuiDockNodeFlags local_cc;
  ImGuiDockNode *local_c8;
  float split_ratio;
  ImVec2 local_90;
  ImVec2 size_old;
  ImVec2 size_new;
  ImVec2 pos_old;
  ImVec2 pos_new;
  ImGuiAxis split_axis;
  ImGuiDir split_dir;
  int local_54;
  uint local_50;
  int dir;
  ImGuiDockNodeFlags dst_node_flags;
  ImGuiDockNodeFlags src_node_flags;
  ImGuiDockNode *ref_node_for_rect;
  ImGuiDockNode *root_payload_as_host;
  ImGuiContext *g;
  bool is_outer_docking_local;
  ImGuiDockPreviewData *pIStack_28;
  bool is_explicit_target_local;
  ImGuiDockPreviewData *data_local;
  ImGuiWindow *root_payload_local;
  ImGuiDockNode *host_node_local;
  ImGuiWindow *host_window_local;
  
  root_payload_as_host = (ImGuiDockNode *)GImGui;
  ref_node_for_rect = root_payload->DockNodeAsHost;
  local_c8 = host_node;
  g._6_1_ = is_outer_docking;
  g._7_1_ = is_explicit_target;
  pIStack_28 = data;
  data_local = (ImGuiDockPreviewData *)root_payload;
  root_payload_local = (ImGuiWindow *)host_node;
  host_node_local = (ImGuiDockNode *)host_window;
  if ((host_node != (ImGuiDockNode *)0x0) && ((*(ushort *)&host_node->field_0xb8 >> 9 & 1) == 0)) {
    local_c8 = DockNodeGetRootNode(host_node);
  }
  _dst_node_flags = local_c8;
  if ((local_c8 != (ImGuiDockNode *)0x0) && ((*(ushort *)&local_c8->field_0xb8 >> 9 & 1) == 0)) {
    __assert_fail("ref_node_for_rect->IsVisible",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3583,
                  "void ImGui::DockNodePreviewDockSetup(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, ImGuiDockPreviewData *, bool, bool)"
                 );
  }
  if (ref_node_for_rect == (ImGuiDockNode *)0x0) {
    local_cc = *(ImGuiDockNodeFlags *)((long)(data_local->FutureNode).ChildNodes + 0xc);
  }
  else {
    local_cc = ImGuiDockNode::GetMergedFlags(ref_node_for_rect);
  }
  dir = local_cc;
  if (root_payload_local == (ImGuiWindow *)0x0) {
    local_d0 = *(uint *)((long)host_node_local->ChildNodes + 0xc);
  }
  else {
    local_d0 = ImGuiDockNode::GetMergedFlags((ImGuiDockNode *)root_payload_local);
  }
  local_50 = local_d0;
  pIStack_28->IsCenterAvailable = true;
  if ((g._6_1_ & 1) == 0) {
    if ((local_d0 & 0x10000) == 0) {
      if (((root_payload_local == (ImGuiWindow *)0x0) || ((local_d0 & 4) == 0)) ||
         (bVar3 = ImGuiDockNode::IsCentralNode((ImGuiDockNode *)root_payload_local), !bVar3)) {
        if (((root_payload_local != (ImGuiWindow *)0x0) &&
            (bVar3 = ImGuiDockNode::IsEmpty((ImGuiDockNode *)root_payload_local), bVar3)) ||
           ((ref_node_for_rect == (ImGuiDockNode *)0x0 ||
            ((bVar3 = ImGuiDockNode::IsSplitNode(ref_node_for_rect), !bVar3 ||
             (ref_node_for_rect->OnlyNodeWithWindows != (ImGuiDockNode *)0x0)))))) {
          if (((local_50 & 0x80000) != 0) || ((dir & 0x100000U) != 0)) {
            pIStack_28->IsCenterAvailable = false;
          }
        }
        else {
          pIStack_28->IsCenterAvailable = false;
        }
      }
      else {
        pIStack_28->IsCenterAvailable = false;
      }
    }
    else {
      pIStack_28->IsCenterAvailable = false;
    }
  }
  else {
    pIStack_28->IsCenterAvailable = false;
  }
  pIStack_28->IsSidesAvailable = true;
  if (((local_50 & 0x10) == 0) && ((root_payload_as_host[1].LocalFlags & 1) == 0)) {
    if (((((g._6_1_ & 1) == 0) && (root_payload_local != (ImGuiWindow *)0x0)) &&
        (lVar2._0_4_ = root_payload_local->FlagsPreviousFrame,
        lVar2._4_4_ = (root_payload_local->WindowClass).ClassId, lVar2 == 0)) &&
       (bVar3 = ImGuiDockNode::IsCentralNode((ImGuiDockNode *)root_payload_local), bVar3)) {
      pIStack_28->IsSidesAvailable = false;
    }
    else if (((local_50 & 0x20000) != 0) || ((dir & 0x40000U) != 0)) {
      pIStack_28->IsSidesAvailable = false;
    }
  }
  else {
    pIStack_28->IsSidesAvailable = false;
  }
  if (root_payload_local == (ImGuiWindow *)0x0) {
    local_d1 = (byte)host_node_local[1].LocalFlags;
  }
  else {
    local_d1 = (byte)((ushort)*(undefined2 *)&(root_payload_local->ScrollbarSizes).y >> 0xb) & 1;
  }
  local_d2 = 1;
  if ((local_d1 & 1) == 0) {
    local_d2 = *(byte *)&data_local->SplitNode;
  }
  *(ushort *)&(pIStack_28->FutureNode).field_0xb8 =
       *(ushort *)&(pIStack_28->FutureNode).field_0xb8 & 0xf7ff | (ushort)(local_d2 & 1) << 0xb;
  if (root_payload_local == (ImGuiWindow *)0x0) {
    local_d3 = (*(uint *)&host_node_local->field_0xc & 0x20) == 0;
  }
  else {
    local_d3 = true;
  }
  *(ushort *)&(pIStack_28->FutureNode).field_0xb8 =
       *(ushort *)&(pIStack_28->FutureNode).field_0xb8 & 0xefff | (ushort)local_d3 << 0xc;
  if (_dst_node_flags == (ImGuiDockNode *)0x0) {
    local_e0 = &host_node_local->Size;
  }
  else {
    local_e0 = &_dst_node_flags->Pos;
  }
  (pIStack_28->FutureNode).Pos = *local_e0;
  if (_dst_node_flags == (ImGuiDockNode *)0x0) {
    local_e8 = &host_node_local->SizeRef;
  }
  else {
    local_e8 = &_dst_node_flags->Size;
  }
  (pIStack_28->FutureNode).Size = *local_e8;
  pIStack_28->SplitNode = (ImGuiDockNode *)root_payload_local;
  pIStack_28->SplitDir = -1;
  pIStack_28->IsSplitDirExplicit = false;
  if ((host_node_local[1].ID & 0x10000) == 0) {
    for (local_54 = -1; local_54 < 4; local_54 = local_54 + 1) {
      if (((local_54 != -1) || ((pIStack_28->IsCenterAvailable & 1U) != 0)) &&
         ((local_54 == -1 || ((pIStack_28->IsSidesAvailable & 1U) != 0)))) {
        _split_axis = ImGuiDockNode::Rect(&pIStack_28->FutureNode);
        bVar3 = DockNodeCalcDropRectsAndTestMousePos
                          ((ImRect *)&split_axis,local_54,pIStack_28->DropRectsDraw + (local_54 + 1)
                           ,(bool)(g._6_1_ & 1),
                           (ImVec2 *)&root_payload_as_host[1].WindowClass.ParentViewportId);
        if (bVar3) {
          pIStack_28->SplitDir = local_54;
          pIStack_28->IsSplitDirExplicit = true;
        }
      }
    }
  }
  local_e9 = 1;
  if (pIStack_28->SplitDir == -1) {
    local_e9 = pIStack_28->IsCenterAvailable;
  }
  pIStack_28->IsDropAllowed = (bool)(local_e9 & 1);
  if ((((g._7_1_ & 1) == 0) && ((pIStack_28->IsSplitDirExplicit & 1U) == 0)) &&
     ((root_payload_as_host[1].LocalFlags & 0x100) == 0)) {
    pIStack_28->IsDropAllowed = false;
  }
  pIStack_28->SplitRatio = 0.0;
  if (pIStack_28->SplitDir != -1) {
    dir_00 = pIStack_28->SplitDir;
    local_ea = dir_00 < 2;
    ImVec2::ImVec2((ImVec2 *)&pos_old.y);
    size_new = (pIStack_28->FutureNode).Pos;
    ImVec2::ImVec2(&size_old);
    local_90 = (pIStack_28->FutureNode).Size;
    DockNodeCalcSplitRects
              (&size_new,&local_90,(ImVec2 *)&pos_old.y,&size_old,dir_00,
               (data_local->FutureNode).SizeRef);
    pfVar4 = ImVec2::operator[](&size_old,(long)(int)((byte)~local_ea & 1));
    fVar1 = *pfVar4;
    pfVar4 = ImVec2::operator[](&(pIStack_28->FutureNode).Size,(long)(int)((byte)~local_ea & 1));
    local_f4 = ImSaturate(fVar1 / *pfVar4);
    (pIStack_28->FutureNode).Pos = stack0xffffffffffffff8c;
    (pIStack_28->FutureNode).Size = size_old;
    if ((dir_00 == 1) || (dir_00 == 3)) {
      local_f4 = 1.0 - local_f4;
    }
    pIStack_28->SplitRatio = local_f4;
  }
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockSetup(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, ImGuiDockPreviewData* data, bool is_explicit_target, bool is_outer_docking)
{
    ImGuiContext& g = *GImGui;

    // There is an edge case when docking into a dockspace which only has inactive nodes.
    // In this case DockNodeTreeFindNodeByPos() will have selected a leaf node which is inactive.
    // Because the inactive leaf node doesn't have proper pos/size yet, we'll use the root node as reference.
    ImGuiDockNode* root_payload_as_host = root_payload->DockNodeAsHost;
    ImGuiDockNode* ref_node_for_rect = (host_node && !host_node->IsVisible) ? DockNodeGetRootNode(host_node) : host_node;
    if (ref_node_for_rect)
        IM_ASSERT(ref_node_for_rect->IsVisible);

    // Filter, figure out where we are allowed to dock
    ImGuiDockNodeFlags src_node_flags = root_payload_as_host ? root_payload_as_host->GetMergedFlags() : root_payload->WindowClass.DockNodeFlagsOverrideSet;
    ImGuiDockNodeFlags dst_node_flags = host_node ? host_node->GetMergedFlags() : host_window->WindowClass.DockNodeFlagsOverrideSet;
    data->IsCenterAvailable = true;
    if (is_outer_docking)
        data->IsCenterAvailable = false;
    else if (dst_node_flags & ImGuiDockNodeFlags_NoDocking)
        data->IsCenterAvailable = false;
    else if (host_node && (dst_node_flags & ImGuiDockNodeFlags_NoDockingInCentralNode) && host_node->IsCentralNode())
        data->IsCenterAvailable = false;
    else if ((!host_node || !host_node->IsEmpty()) && root_payload_as_host && root_payload_as_host->IsSplitNode() && (root_payload_as_host->OnlyNodeWithWindows == NULL)) // Is _visibly_ split?
        data->IsCenterAvailable = false;
    else if ((dst_node_flags & ImGuiDockNodeFlags_NoDockingOverMe) || (src_node_flags & ImGuiDockNodeFlags_NoDockingOverOther))
        data->IsCenterAvailable = false;

    data->IsSidesAvailable = true;
    if ((dst_node_flags & ImGuiDockNodeFlags_NoSplit) || g.IO.ConfigDockingNoSplit)
        data->IsSidesAvailable = false;
    else if (!is_outer_docking && host_node && host_node->ParentNode == NULL && host_node->IsCentralNode())
        data->IsSidesAvailable = false;
    else if ((dst_node_flags & ImGuiDockNodeFlags_NoDockingSplitMe) || (src_node_flags & ImGuiDockNodeFlags_NoDockingSplitOther))
        data->IsSidesAvailable = false;

    // Build a tentative future node (reuse same structure because it is practical. Shape will be readjusted when previewing a split)
    data->FutureNode.HasCloseButton = (host_node ? host_node->HasCloseButton : host_window->HasCloseButton) || (root_payload->HasCloseButton);
    data->FutureNode.HasWindowMenuButton = host_node ? true : ((host_window->Flags & ImGuiWindowFlags_NoCollapse) == 0);
    data->FutureNode.Pos = ref_node_for_rect ? ref_node_for_rect->Pos : host_window->Pos;
    data->FutureNode.Size = ref_node_for_rect ? ref_node_for_rect->Size : host_window->Size;

    // Calculate drop shapes geometry for allowed splitting directions
    IM_ASSERT(ImGuiDir_None == -1);
    data->SplitNode = host_node;
    data->SplitDir = ImGuiDir_None;
    data->IsSplitDirExplicit = false;
    if (!host_window->Collapsed)
        for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
        {
            if (dir == ImGuiDir_None && !data->IsCenterAvailable)
                continue;
            if (dir != ImGuiDir_None && !data->IsSidesAvailable)
                continue;
            if (DockNodeCalcDropRectsAndTestMousePos(data->FutureNode.Rect(), (ImGuiDir)dir, data->DropRectsDraw[dir+1], is_outer_docking, &g.IO.MousePos))
            {
                data->SplitDir = (ImGuiDir)dir;
                data->IsSplitDirExplicit = true;
            }
        }

    // When docking without holding Shift, we only allow and preview docking when hovering over a drop rect or over the title bar
    data->IsDropAllowed = (data->SplitDir != ImGuiDir_None) || (data->IsCenterAvailable);
    if (!is_explicit_target && !data->IsSplitDirExplicit && !g.IO.ConfigDockingWithShift)
        data->IsDropAllowed = false;

    // Calculate split area
    data->SplitRatio = 0.0f;
    if (data->SplitDir != ImGuiDir_None)
    {
        ImGuiDir split_dir = data->SplitDir;
        ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        ImVec2 pos_new, pos_old = data->FutureNode.Pos;
        ImVec2 size_new, size_old = data->FutureNode.Size;
        DockNodeCalcSplitRects(pos_old, size_old, pos_new, size_new, split_dir, root_payload->Size);

        // Calculate split ratio so we can pass it down the docking request
        float split_ratio = ImSaturate(size_new[split_axis] / data->FutureNode.Size[split_axis]);
        data->FutureNode.Pos = pos_new;
        data->FutureNode.Size = size_new;
        data->SplitRatio = (split_dir == ImGuiDir_Right || split_dir == ImGuiDir_Down) ? (1.0f - split_ratio) : (split_ratio);
    }
}